

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

int sb_qp_sweep(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp,
               int mi_row,int mi_col,BLOCK_SIZE bsize,SIMPLE_MOTION_DATA_TREE *sms_tree,
               SB_FIRST_PASS_STATS *sb_org_stats)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  PC_TREE *pPVar5;
  int iVar6;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int backup_current_qindex;
  int alloc_mi_idx;
  int sweep_qp_delta;
  int step;
  int end;
  int start;
  int best_qindex;
  RD_STATS cur_rdc;
  RD_STATS rdc_winner;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  int in_stack_00000288;
  int in_stack_0000028c;
  TokenExtra **in_stack_00000290;
  TileDataEnc *in_stack_00000298;
  ThreadData_conflict *in_stack_000002a0;
  AV1_COMP *in_stack_000002a8;
  BLOCK_SIZE in_stack_000002e0;
  RD_STATS *in_stack_000002e8;
  RD_STATS in_stack_000002f0;
  PC_TREE *in_stack_00000318;
  SIMPLE_MOTION_DATA_TREE *in_stack_00000320;
  int64_t *in_stack_00000328;
  SB_MULTI_PASS_MODE in_stack_00000330;
  RD_RECT_PART_WIN_INFO *in_stack_00000338;
  BLOCK_SIZE in_stack_fffffffffffffedf;
  RD_STATS *in_stack_fffffffffffffef0;
  TileDataEnc *in_stack_fffffffffffffef8;
  ThreadData_conflict *in_stack_ffffffffffffff00;
  AV1_COMP *in_stack_ffffffffffffff08;
  SB_FIRST_PASS_STATS *in_stack_ffffffffffffff10;
  int local_ac;
  int local_9c;
  undefined1 local_98 [4];
  int in_stack_ffffffffffffff6c;
  RD_STATS *in_stack_ffffffffffffff70;
  TileDataEnc *in_stack_ffffffffffffff78;
  ThreadData_conflict *in_stack_ffffffffffffff80;
  AV1_COMP *in_stack_ffffffffffffff88;
  AV1_COMP *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  
  av1_invalid_rd_stats((RD_STATS *)&stack0xffffffffffffff90);
  local_9c = *(int *)(in_RSI + 0x4210);
  local_ac = -0xc;
  if (*(char *)(in_RDI + 0x3bf80) == '\0') {
    local_ac = -0x14;
  }
  iVar3 = 0xc;
  if (*(char *)(in_RDI + 0x3bf80) == '\0') {
    iVar3 = 0x14;
  }
  iVar1 = *(int *)(in_RDI + 0x41ed4);
  do {
    if (iVar3 < local_ac) {
      return local_9c;
    }
    sb_qp_sweep_init_quantizers
              (in_stack_ffffffffffffff90,(ThreadData_conflict *)in_stack_ffffffffffffff88,
               (TileDataEnc *)in_stack_ffffffffffffff80,
               (SIMPLE_MOTION_DATA_TREE *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8);
    iVar4 = get_alloc_mi_idx((CommonModeInfoParams *)(in_RDI + 0x3c188),in_R8D,in_R9D);
    uVar2 = *(undefined4 *)(*(long *)(in_RDI + 0x3c1a0) + (long)iVar4 * 0xb0 + 4);
    av1_reset_mbmi((CommonModeInfoParams *)in_stack_ffffffffffffff00,
                   (BLOCK_SIZE)((ulong)in_stack_fffffffffffffef8 >> 0x38),
                   (int)in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    av1_restore_sb_state
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8,(int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
               (int)in_stack_fffffffffffffef0);
    *(undefined4 *)(*(long *)(in_RDI + 0x3c1a0) + (long)iVar4 * 0xb0 + 4) = uVar2;
    pPVar5 = av1_alloc_pc_tree_node(in_stack_fffffffffffffedf);
    *(PC_TREE **)(in_RSI + 0x26e50) = pPVar5;
    in_stack_fffffffffffffef0 = in_stack_ffffffffffffff70;
    in_stack_fffffffffffffef8 = in_stack_ffffffffffffff78;
    in_stack_ffffffffffffff00 = in_stack_ffffffffffffff80;
    in_stack_ffffffffffffff08 = in_stack_ffffffffffffff88;
    if (*(long *)(in_RSI + 0x26e50) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RSI + 0x2b90),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
      in_stack_fffffffffffffef0 = in_stack_ffffffffffffff70;
      in_stack_fffffffffffffef8 = in_stack_ffffffffffffff78;
      in_stack_ffffffffffffff00 = in_stack_ffffffffffffff80;
      in_stack_ffffffffffffff08 = in_stack_ffffffffffffff88;
    }
    in_stack_ffffffffffffff10 = *(SB_FIRST_PASS_STATS **)(in_RSI + 0x26e50);
    in_stack_ffffffffffffff70 = in_stack_fffffffffffffef0;
    in_stack_ffffffffffffff78 = in_stack_fffffffffffffef8;
    in_stack_ffffffffffffff80 = in_stack_ffffffffffffff00;
    in_stack_ffffffffffffff88 = in_stack_ffffffffffffff08;
    av1_rd_pick_partition
              (in_stack_000002a8,in_stack_000002a0,in_stack_00000298,in_stack_00000290,
               in_stack_0000028c,in_stack_00000288,in_stack_000002e0,in_stack_000002e8,
               in_stack_000002f0,in_stack_00000318,in_stack_00000320,in_stack_00000328,
               in_stack_00000330,in_stack_00000338);
    if ((long)in_stack_ffffffffffffff78 <
        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)) {
LAB_005266ee:
      memcpy(&stack0xffffffffffffff90,local_98,0x28);
      local_9c = *(int *)(in_RSI + 0x4210) + local_ac;
    }
    else {
      iVar4 = local_ac;
      if (local_ac < 1) {
        iVar4 = -local_ac;
      }
      iVar6 = local_9c - *(int *)(in_RSI + 0x4210);
      if (iVar6 < 1) {
        iVar6 = -iVar6;
      }
      if ((iVar4 < iVar6) &&
         ((TileDataEnc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0) ==
          in_stack_ffffffffffffff78)) goto LAB_005266ee;
    }
    local_ac = iVar1 + local_ac;
  } while( true );
}

Assistant:

static int sb_qp_sweep(AV1_COMP *const cpi, ThreadData *td,
                       TileDataEnc *tile_data, TokenExtra **tp, int mi_row,
                       int mi_col, BLOCK_SIZE bsize,
                       SIMPLE_MOTION_DATA_TREE *sms_tree,
                       SB_FIRST_PASS_STATS *sb_org_stats) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &td->mb;
  RD_STATS rdc_winner, cur_rdc;
  av1_invalid_rd_stats(&rdc_winner);

  int best_qindex = td->mb.rdmult_delta_qindex;
  const int start = cm->current_frame.frame_type == KEY_FRAME ? -20 : -12;
  const int end = cm->current_frame.frame_type == KEY_FRAME ? 20 : 12;
  const int step = cm->delta_q_info.delta_q_res;

  for (int sweep_qp_delta = start; sweep_qp_delta <= end;
       sweep_qp_delta += step) {
    sb_qp_sweep_init_quantizers(cpi, td, tile_data, sms_tree, &cur_rdc, mi_row,
                                mi_col, sweep_qp_delta);

    const int alloc_mi_idx = get_alloc_mi_idx(&cm->mi_params, mi_row, mi_col);
    const int backup_current_qindex =
        cm->mi_params.mi_alloc[alloc_mi_idx].current_qindex;

    av1_reset_mbmi(&cm->mi_params, bsize, mi_row, mi_col);
    av1_restore_sb_state(sb_org_stats, cpi, td, tile_data, mi_row, mi_col);
    cm->mi_params.mi_alloc[alloc_mi_idx].current_qindex = backup_current_qindex;

    td->pc_root = av1_alloc_pc_tree_node(bsize);
    if (!td->pc_root)
      aom_internal_error(x->e_mbd.error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
    av1_rd_pick_partition(cpi, td, tile_data, tp, mi_row, mi_col, bsize,
                          &cur_rdc, cur_rdc, td->pc_root, sms_tree, NULL,
                          SB_DRY_PASS, NULL);

    if ((rdc_winner.rdcost > cur_rdc.rdcost) ||
        (abs(sweep_qp_delta) < abs(best_qindex - x->rdmult_delta_qindex) &&
         rdc_winner.rdcost == cur_rdc.rdcost)) {
      rdc_winner = cur_rdc;
      best_qindex = x->rdmult_delta_qindex + sweep_qp_delta;
    }
  }

  return best_qindex;
}